

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_api.c
# Opt level: O0

void lua_xmove(lua_State *L,lua_State *to,int n)

{
  undefined8 *puVar1;
  uint in_EDX;
  long in_RSI;
  long in_RDI;
  TValue *t;
  TValue *f;
  undefined8 in_stack_ffffffffffffff98;
  lua_State *in_stack_ffffffffffffffa0;
  undefined8 *puVar2;
  uint local_54;
  
  if (in_RDI != in_RSI) {
    if ((long)((ulong)*(uint *)(in_RSI + 0x20) - *(long *)(in_RSI + 0x18)) <=
        (long)((ulong)in_EDX * 8)) {
      lj_state_growstack(in_stack_ffffffffffffffa0,(MSize)((ulong)in_stack_ffffffffffffff98 >> 0x20)
                        );
    }
    puVar2 = *(undefined8 **)(in_RDI + 0x18);
    puVar1 = (undefined8 *)(*(long *)(in_RSI + 0x18) + (long)(int)in_EDX * 8);
    *(undefined8 **)(in_RSI + 0x18) = puVar1;
    local_54 = in_EDX;
    while (local_54 = local_54 - 1, -1 < (int)local_54) {
      puVar1 = puVar1 + -1;
      puVar2 = puVar2 + -1;
      *puVar1 = *puVar2;
    }
    *(undefined8 **)(in_RDI + 0x18) = puVar2;
  }
  return;
}

Assistant:

LUA_API void lua_xmove(lua_State *L, lua_State *to, int n)
{
  TValue *f, *t;
  if (L == to) return;
  lj_checkapi_slot(n);
  lj_checkapi(G(L) == G(to), "move across global states");
  lj_state_checkstack(to, (MSize)n);
  f = L->top;
  t = to->top = to->top + n;
  while (--n >= 0) copyTV(to, --t, --f);
  L->top = f;
}